

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ures.h
# Opt level: O2

UnicodeString *
icu_63::ures_getNextUnicodeString
          (UnicodeString *__return_storage_ptr__,UResourceBundle *resB,char **key,UErrorCode *status
          )

{
  int32_t len;
  ConstChar16Ptr local_28 [3];
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003d8fe8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  len = 0;
  local_28[0].p_ = ures_getNextString_63(resB,&len,key,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::setTo(__return_storage_ptr__,'\x01',local_28,len);
  }
  else {
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString
ures_getNextUnicodeString(UResourceBundle *resB, const char ** key, UErrorCode* status) {
    UnicodeString result;
    int32_t len = 0;
    const UChar* r = ures_getNextString(resB, &len, key, status);
    if(U_SUCCESS(*status)) {
        result.setTo(TRUE, r, len);
    } else {
        result.setToBogus();
    }
    return result;
}